

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O2

void __thiscall
bezier::BinomialCoefficients<4UL>::BinomialCoefficients(BinomialCoefficients<4UL> *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  size_t k;
  undefined1 auVar3 [16];
  
  (this->mCoefficients)._M_elems[4] = 0;
  (this->mCoefficients)._M_elems[2] = 0;
  (this->mCoefficients)._M_elems[3] = 0;
  (this->mCoefficients)._M_elems[0] = 0;
  (this->mCoefficients)._M_elems[1] = 0;
  for (k = 0; k != 3; k = k + 1) {
    sVar2 = internal::binomial(4,k);
    (this->mCoefficients)._M_elems[k] = sVar2;
  }
  auVar1 = *(undefined1 (*) [16])(this->mCoefficients)._M_elems;
  auVar3._0_8_ = auVar1._8_8_;
  auVar3._8_4_ = auVar1._0_4_;
  auVar3._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])((this->mCoefficients)._M_elems + 3) = auVar3;
  return;
}

Assistant:

BinomialCoefficients()
        {
            size_t center = N / 2;
            size_t k = 0;

            while (k <= center)
            {
                mCoefficients[k] = internal::binomial(N, k);
                k++;
            }

            // Utilize the symmetrical nature of the binomial coefficients.
            while (k <= N)
            {
                mCoefficients[k] = mCoefficients[N - k];
                k++;
            }
        }